

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O2

void __thiscall Hes_Apu::write_data(Hes_Apu *this,blip_time_t time,int addr,int data)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  Hes_Osc *this_00;
  
  if (addr == 0x801) {
    if (this->balance == data) {
      return;
    }
    this->balance = data;
    lVar3 = 0x230;
    do {
      Hes_Osc::run_until((Hes_Osc *)(this->oscs[0].wave + lVar3),&this->synth,time);
      balance_changed(this,this->oscs);
      lVar3 = lVar3 + -0x70;
    } while (lVar3 != -0x70);
    return;
  }
  if (addr == 0x800) {
    this->latch = data & 7;
    return;
  }
  iVar1 = this->latch;
  if (5 < (long)iVar1) {
    return;
  }
  this_00 = this->oscs + iVar1;
  Hes_Osc::run_until(this_00,&this->synth,time);
  bVar2 = (byte)data;
  switch(addr) {
  case 0x802:
    this_00->period = this_00->period & 0xf00U | data;
    break;
  case 0x803:
    this_00->period = (data & 0xfU) << 8 | (uint)(byte)this_00->period;
    break;
  case 0x804:
    if ((~data & *(uint *)&this_00->control & 0x40) != 0) {
      this_00->phase = '\0';
    }
    this_00->control = bVar2;
    goto LAB_00564c71;
  case 0x805:
    this_00->balance = bVar2;
LAB_00564c71:
    balance_changed(this,this_00);
    return;
  case 0x806:
    if ((this_00->control & 0x40) == 0) {
      this_00->wave[this_00->phase] = bVar2 & 0x1f;
      this_00->phase = this_00->phase + 1 & 0x1f;
    }
    else if ((char)this_00->control < '\0') {
      this_00->dac = bVar2 & 0x1f;
    }
    break;
  case 0x807:
    if (3 < iVar1) {
      this_00->noise = bVar2;
    }
  }
  return;
}

Assistant:

void Hes_Apu::write_data( blip_time_t time, int addr, int data )
{
	if ( addr == 0x800 )
	{
		latch = data & 7;
	}
	else if ( addr == 0x801 )
	{
		if ( balance != data )
		{
			balance = data;
			
			Hes_Osc* osc = &oscs [osc_count];
			do
			{
				osc--;
				osc->run_until( synth, time );
				balance_changed( *oscs );
			}
			while ( osc != oscs );
		}
	}
	else if ( latch < osc_count )
	{
		Hes_Osc& osc = oscs [latch];
		osc.run_until( synth, time );
		switch ( addr )
		{
		case 0x802:
			osc.period = (osc.period & 0xF00) | data;
			break;
		
		case 0x803:
			osc.period = (osc.period & 0x0FF) | ((data & 0x0F) << 8);
			break;
		
		case 0x804:
			if ( osc.control & 0x40 & ~data )
				osc.phase = 0;
			osc.control = data;
			balance_changed( osc );
			break;
		
		case 0x805:
			osc.balance = data;
			balance_changed( osc );
			break;
		
		case 0x806:
			data &= 0x1F;
			if ( !(osc.control & 0x40) )
			{
				osc.wave [osc.phase] = data;
				osc.phase = (osc.phase + 1) & 0x1F;
			}
			else if ( osc.control & 0x80 )
			{
				osc.dac = data;
			}
			break;
		
		 case 0x807:
		 	if ( &osc >= &oscs [4] )
		 		osc.noise = data;
		 	break;
		 
		 case 0x809:
		 	if ( !(data & 0x80) && (data & 0x03) != 0 )
		 		debug_printf( "HES LFO not supported\n" );
		}
	}
}